

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_client_handshake(lws *wsi)

{
  lws_context_per_thread *plVar1;
  uint32_t sid_00;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  lws *plVar5;
  uchar *end_00;
  size_t sVar6;
  uint8_t *puVar7;
  lws_write_protocol local_68;
  int sid;
  int m;
  int n;
  lws *nwsi;
  char *uri;
  char *meth;
  uint8_t *end;
  uint8_t *p1;
  uint8_t *p;
  uint8_t *start;
  uint8_t *buf;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  buf = (uint8_t *)(wsi->context->pt + (int)wsi->tsi);
  pt = (lws_context_per_thread *)wsi;
  uri = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
  puVar4 = (uchar *)lws_hdr_simple_ptr((lws *)pt,_WSI_TOKEN_CLIENT_URI);
  plVar5 = lws_get_network_wsi((lws *)pt);
  sid_00 = ((plVar5->h2).h2n)->highest_sid_opened + 2;
  _lws_log(0x10,"%s\n","lws_h2_client_handshake");
  ((plVar5->h2).h2n)->highest_sid_opened = sid_00;
  *(uint32_t *)&(pt->sul_tls).us = sid_00;
  _lws_log(8,"%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n","lws_h2_client_handshake",
           (ulong)(uint)(pt->sul_tls).us);
  plVar1 = pt;
  p1 = (uint8_t *)(*(long *)(buf + 0x128) + 0x10);
  end_00 = p1 + ((ulong)(*(uint *)((long)&pt[1].sul_seq_heartbeat.list.owner[0x35].tail + 4) >> 1) -
                0x11);
  if (uri == (char *)0x0) {
    uri = "GET";
  }
  p = p1;
  start = p1;
  sVar6 = strlen(uri);
  iVar2 = lws_add_http_header_by_token
                    ((lws *)plVar1,WSI_TOKEN_HTTP_COLON_METHOD,(uchar *)uri,(int)sVar6,&p1,end_00);
  if ((iVar2 == 0) &&
     (iVar2 = lws_add_http_header_by_token
                        ((lws *)pt,WSI_TOKEN_HTTP_COLON_SCHEME,(uchar *)"https",5,&p1,end_00),
     plVar1 = pt, iVar2 == 0)) {
    iVar2 = lws_hdr_total_length((lws *)pt,_WSI_TOKEN_CLIENT_URI);
    iVar2 = lws_add_http_header_by_token
                      ((lws *)plVar1,WSI_TOKEN_HTTP_COLON_PATH,puVar4,iVar2,&p1,end_00);
    plVar1 = pt;
    if (iVar2 == 0) {
      puVar4 = (uchar *)lws_hdr_simple_ptr((lws *)pt,_WSI_TOKEN_CLIENT_ORIGIN);
      iVar2 = lws_hdr_total_length((lws *)pt,_WSI_TOKEN_CLIENT_ORIGIN);
      iVar2 = lws_add_http_header_by_token
                        ((lws *)plVar1,WSI_TOKEN_HTTP_COLON_AUTHORITY,puVar4,iVar2,&p1,end_00);
      plVar1 = pt;
      if (iVar2 == 0) {
        puVar4 = (uchar *)lws_hdr_simple_ptr((lws *)pt,_WSI_TOKEN_CLIENT_HOST);
        iVar2 = lws_hdr_total_length((lws *)pt,_WSI_TOKEN_CLIENT_HOST);
        iVar2 = lws_add_http_header_by_token((lws *)plVar1,WSI_TOKEN_HOST,puVar4,iVar2,&p1,end_00);
        if (((iVar2 == 0) &&
            (iVar2 = lws_add_http_header_by_token
                               ((lws *)pt,WSI_TOKEN_HTTP_USER_AGENT,(uchar *)"lwsss",5,&p1,end_00),
            iVar2 == 0)) &&
           ((puVar7 = p1, ((ulong)pt[1].pipe_wsi & 0x40000000000) == 0 ||
            (puVar7 = lws_http_multipart_headers((lws *)pt,p1), puVar7 != (uint8_t *)0x0)))) {
          p1 = puVar7;
          if (((ulong)pt[1].pipe_wsi & 0x80000000000) != 0) {
            iVar2 = lws_add_http_header_by_token
                              ((lws *)pt,WSI_TOKEN_HTTP_CONTENT_TYPE,
                               (uchar *)"application/x-www-form-urlencoded",0x21,&p1,end_00);
            if (iVar2 != 0) goto LAB_00144fae;
            lws_client_http_body_pending((lws *)pt,1);
          }
          iVar2 = (**(code **)(pt[1].sul_ah_lifecheck.cb + 8))
                            (pt,0x18,pt[1].sul_plat.list.next,&p1,end_00 + (-0xc - (long)p1));
          if ((iVar2 == 0) && (iVar2 = lws_finalize_http_header((lws *)pt,&p1,end_00), iVar2 == 0))
          {
            local_68 = LWS_WRITE_HTTP_HEADERS;
            if ((((ulong)pt[1].pipe_wsi & 0x2000000000) != 0) &&
               ((*(ulong *)((long)&pt[1].http.ah_list + 4) >> 0x30 & 1) == 0)) {
              local_68 = LWS_WRITE_CLIENT_IGNORE_XOR_MASK|LWS_WRITE_HTTP_HEADERS;
            }
            uVar3 = lws_write((lws *)pt,p,(long)p1 - (long)p,local_68);
            if ((long)(int)uVar3 != (long)p1 - (long)p) {
              _lws_log(1,"_write returned %d from %ld\n",(ulong)uVar3,(long)p1 - (long)p);
              return -1;
            }
            sid = 0x40000;
            if (((ulong)pt[1].pipe_wsi & 0x20000000000) != 0) {
              sid = *(int *)&(pt->sul_plat).list.owner;
              *(undefined1 *)((long)&(pt->sul_plat).list.owner + 5) = 1;
            }
            iVar2 = lws_h2_update_peer_txcredit((lws *)pt,sid_00,sid);
            if (iVar2 != 0) {
              return 1;
            }
            lws_h2_state((lws *)pt,LWS_H2_STATE_OPEN);
            lwsi_set_state((lws *)pt,0x119);
            if (((ulong)pt[1].pipe_wsi & 0x40000000000) != 0) {
              lws_callback_on_writable((lws *)pt);
            }
            return 0;
          }
        }
      }
    }
  }
LAB_00144fae:
  _lws_log(1,"Client hdrs too long: incr context info.pt_serv_buf_size\n");
  return -1;
}

Assistant:

int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI);
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	nwsi->h2.h2n->highest_sid_opened = sid;
	wsi->mux.my_sid = sid;

	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)uri,
				lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_ORIGIN),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_HOST),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_USER_AGENT,
				(unsigned char *)"lwsss", 5,
				&p, end))
		goto fail_length;

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, (end - p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, p - start, m);

	if (n != (p - start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}